

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

Gia_Man_t * Gia_PolynCoreDetectTest(Gia_Man_t *pGia,int fAddExtra,int fAddCones,int fVerbose)

{
  Vec_Int_t *vAddCos;
  Gia_Man_t *pGVar1;
  
  if (fAddExtra == 0) {
    vAddCos = (Vec_Int_t *)malloc(0x10);
    vAddCos->nCap = 0;
    vAddCos->nSize = 0;
    vAddCos->pArray = (int *)0x0;
  }
  else {
    vAddCos = Gia_PolynAddHaRoots(pGia);
  }
  pGVar1 = Gia_PolynCoreDetectTest_int(pGia,vAddCos,fAddCones,fVerbose);
  printf("On top of %d COs, created %d new adder outputs.\n",(ulong)(uint)pGia->vCos->nSize,
         (ulong)(uint)vAddCos->nSize);
  if (vAddCos->pArray != (int *)0x0) {
    free(vAddCos->pArray);
    vAddCos->pArray = (int *)0x0;
  }
  if (vAddCos != (Vec_Int_t *)0x0) {
    free(vAddCos);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest( Gia_Man_t * pGia, int fAddExtra, int fAddCones, int fVerbose )
{
    Vec_Int_t * vAddCos = fAddExtra ? Gia_PolynAddHaRoots( pGia ) : Vec_IntAlloc(0);
    Gia_Man_t * pNew = Gia_PolynCoreDetectTest_int( pGia, vAddCos, fAddCones, fVerbose );
    printf( "On top of %d COs, created %d new adder outputs.\n", Gia_ManCoNum(pGia), Vec_IntSize(vAddCos) );
    Vec_IntFree( vAddCos );
    return pNew;
}